

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

void vsencoding::__vseblocks_unpack10(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (0x1f < bs + 0x1f) {
    uVar11 = bs + 0x1f >> 5;
    auVar14._8_8_ = 0x20000000c;
    auVar14._0_8_ = 0x20000000c;
    auVar15._8_4_ = 0x3ff;
    auVar15._0_8_ = 0x3ff000003ff;
    auVar15._12_4_ = 0x3ff;
    auVar2 = vpmovsxbd_avx(ZEXT416(0x6040e18));
    auVar6 = vpmovsxwd_avx(ZEXT816(0x3c003ff03ff0000));
    auVar3 = vpmovsxbd_avx(ZEXT416(0x406101a));
    auVar7 = vpmovsxwd_avx(ZEXT816(0x3f003ff03ff0000));
    auVar4 = vpmovsxbd_avx(ZEXT416(0x3020107));
    auVar5 = vpmovsxbd_avx(ZEXT416(0x208121c));
    auVar8 = vpmovsxwd_avx(ZEXT816(0x3fc03ff03ff0000));
    auVar16._8_8_ = 0xa00000014;
    auVar16._0_8_ = 0xa00000014;
    do {
      uVar1 = *in;
      *out = uVar1 >> 0x16;
      auVar12 = vpbroadcastd_avx512vl();
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar15);
      *(long *)(out + 1) = auVar12._0_8_;
      uVar10 = (uVar1 & 3) << 8;
      out[3] = uVar10;
      uVar1 = in[1];
      auVar12._4_4_ = uVar1;
      auVar12._0_4_ = uVar1;
      auVar12._8_4_ = uVar1;
      auVar12._12_4_ = uVar1;
      auVar9 = vpsrlvd_avx2(auVar12,auVar2);
      auVar13 = vpsllvd_avx2(auVar12,auVar2);
      auVar12 = vpinsrd_avx(auVar6,uVar10,0);
      auVar17 = vpblendd_avx2(auVar9,auVar13,8);
      auVar13 = vpor_avx(auVar9,auVar12);
      auVar12 = vpand_avx(auVar17,auVar6);
      auVar13 = vpblendd_avx2(auVar12,auVar13,1);
      *(undefined1 (*) [16])(out + 3) = auVar13;
      uVar1 = in[2];
      auVar19._4_4_ = uVar1;
      auVar19._0_4_ = uVar1;
      auVar19._8_4_ = uVar1;
      auVar19._12_4_ = uVar1;
      auVar9 = vpsrlvd_avx2(auVar19,auVar3);
      auVar13 = vpsllvd_avx2(auVar19,auVar3);
      auVar17 = vpblendd_avx2(auVar9,auVar13,8);
      auVar12 = vpermt2d_avx512vl(auVar7,auVar4,auVar12);
      auVar13 = vpor_avx(auVar9,auVar12);
      auVar12 = vpand_avx(auVar17,auVar12);
      auVar13 = vpblendd_avx2(auVar12,auVar13,1);
      *(undefined1 (*) [16])(out + 6) = auVar13;
      uVar1 = in[3];
      auVar13._4_4_ = uVar1;
      auVar13._0_4_ = uVar1;
      auVar13._8_4_ = uVar1;
      auVar13._12_4_ = uVar1;
      auVar9 = vpsrlvd_avx2(auVar13,auVar5);
      auVar13 = vpsllvd_avx2(auVar13,auVar5);
      auVar17 = vpblendd_avx2(auVar9,auVar13,8);
      auVar12 = vpermt2d_avx512vl(auVar8,auVar4,auVar12);
      auVar13 = vpor_avx(auVar9,auVar12);
      auVar12 = vpand_avx(auVar17,auVar12);
      auVar13 = vpblendd_avx2(auVar12,auVar13,1);
      *(undefined1 (*) [16])(out + 9) = auVar13;
      auVar13 = vpbroadcastd_avx512vl();
      auVar13 = vpsrlvd_avx2(auVar13,auVar16);
      auVar13 = vpinsrd_avx(auVar13,in[4],2);
      out[0xc] = auVar12._12_4_ | in[4] >> 0x1e;
      uVar1 = in[5];
      auVar17 = vpinsrd_avx(auVar13,uVar1,3);
      auVar12 = vpand_avx(auVar13,auVar15);
      auVar13 = vpsrld_avx(auVar17,0x16);
      auVar12 = vpblendd_avx2(auVar12,auVar13,8);
      *(undefined1 (*) [16])(out + 0xd) = auVar12;
      auVar12 = vpbroadcastd_avx512vl();
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar15);
      *(long *)(out + 0x11) = auVar12._0_8_;
      uVar10 = (uVar1 & 3) << 8;
      out[0x13] = uVar10;
      uVar1 = in[6];
      auVar17._4_4_ = uVar1;
      auVar17._0_4_ = uVar1;
      auVar17._8_4_ = uVar1;
      auVar17._12_4_ = uVar1;
      auVar13 = vpsrlvd_avx2(auVar17,auVar2);
      auVar12 = vpsllvd_avx2(auVar17,auVar2);
      auVar17 = vpblendd_avx2(auVar13,auVar12,8);
      auVar12 = vpinsrd_avx(auVar6,uVar10,0);
      auVar13 = vpor_avx(auVar13,auVar12);
      auVar12 = vpand_avx(auVar17,auVar6);
      auVar13 = vpblendd_avx2(auVar12,auVar13,1);
      *(undefined1 (*) [16])(out + 0x13) = auVar13;
      uVar1 = in[7];
      auVar20._4_4_ = uVar1;
      auVar20._0_4_ = uVar1;
      auVar20._8_4_ = uVar1;
      auVar20._12_4_ = uVar1;
      auVar9 = vpsrlvd_avx2(auVar20,auVar3);
      auVar13 = vpsllvd_avx2(auVar20,auVar3);
      auVar17 = vpblendd_avx2(auVar9,auVar13,8);
      auVar12 = vpermt2d_avx512vl(auVar7,auVar4,auVar12);
      auVar13 = vpor_avx(auVar9,auVar12);
      auVar12 = vpand_avx(auVar17,auVar12);
      auVar13 = vpblendd_avx2(auVar12,auVar13,1);
      *(undefined1 (*) [16])(out + 0x16) = auVar13;
      uVar1 = in[8];
      auVar18._4_4_ = uVar1;
      auVar18._0_4_ = uVar1;
      auVar18._8_4_ = uVar1;
      auVar18._12_4_ = uVar1;
      auVar9 = vpsrlvd_avx2(auVar18,auVar5);
      auVar13 = vpsllvd_avx2(auVar18,auVar5);
      auVar17 = vpblendd_avx2(auVar9,auVar13,8);
      auVar12 = vpermt2d_avx512vl(auVar8,auVar4,auVar12);
      auVar13 = vpor_avx(auVar9,auVar12);
      auVar12 = vpand_avx(auVar17,auVar12);
      auVar13 = vpblendd_avx2(auVar12,auVar13,1);
      *(undefined1 (*) [16])(out + 0x19) = auVar13;
      uVar1 = in[9];
      out[0x1c] = auVar12._12_4_ | uVar1 >> 0x1e;
      auVar12 = vpbroadcastd_avx512vl();
      auVar12 = vpsrlvd_avx2(auVar12,auVar16);
      auVar12 = vpand_avx(auVar12,auVar15);
      *(long *)(out + 0x1d) = auVar12._0_8_;
      out[0x1f] = uVar1 & 0x3ff;
      out = out + 0x20;
      in = in + 10;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack10(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 10, --bs) {
    out[0] = in[0] >> 22;
    out[1] = (in[0] >> 12) & 0x03ff;
    out[2] = (in[0] >> 2) & 0x03ff;
    out[3] = (in[0] << 8) & 0x03ff;
    out[3] |= in[1] >> 24;
    out[4] = (in[1] >> 14) & 0x03ff;
    out[5] = (in[1] >> 4) & 0x03ff;
    out[6] = (in[1] << 6) & 0x03ff;
    out[6] |= in[2] >> 26;
    out[7] = (in[2] >> 16) & 0x03ff;
    out[8] = (in[2] >> 6) & 0x03ff;
    out[9] = (in[2] << 4) & 0x03ff;
    out[9] |= in[3] >> 28;
    out[10] = (in[3] >> 18) & 0x03ff;
    out[11] = (in[3] >> 8) & 0x03ff;
    out[12] = (in[3] << 2) & 0x03ff;
    out[12] |= in[4] >> 30;
    out[13] = (in[4] >> 20) & 0x03ff;
    out[14] = (in[4] >> 10) & 0x03ff;
    out[15] = in[4] & 0x03ff;
    out[16] = in[5] >> 22;
    out[17] = (in[5] >> 12) & 0x03ff;
    out[18] = (in[5] >> 2) & 0x03ff;
    out[19] = (in[5] << 8) & 0x03ff;
    out[19] |= in[6] >> 24;
    out[20] = (in[6] >> 14) & 0x03ff;
    out[21] = (in[6] >> 4) & 0x03ff;
    out[22] = (in[6] << 6) & 0x03ff;
    out[22] |= in[7] >> 26;
    out[23] = (in[7] >> 16) & 0x03ff;
    out[24] = (in[7] >> 6) & 0x03ff;
    out[25] = (in[7] << 4) & 0x03ff;
    out[25] |= in[8] >> 28;
    out[26] = (in[8] >> 18) & 0x03ff;
    out[27] = (in[8] >> 8) & 0x03ff;
    out[28] = (in[8] << 2) & 0x03ff;
    out[28] |= in[9] >> 30;
    out[29] = (in[9] >> 20) & 0x03ff;
    out[30] = (in[9] >> 10) & 0x03ff;
    out[31] = in[9] & 0x03ff;
  }
}